

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void mips_cpu_do_unaligned_access_mips64
               (CPUState *cs,vaddr addr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  int error_code;
  uint32_t exception;
  MIPSCPU_conflict2 *cpu;
  
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x485c) & 4) == 0) {
    cs[1].tb_jmp_cache[0x20c] = (TranslationBlock *)addr;
  }
  error_code = 0;
  if (access_type == MMU_DATA_STORE) {
    exception = 0xd;
  }
  else {
    exception = 0xc;
    error_code = 0;
    if (access_type == MMU_INST_FETCH) {
      error_code = 2;
    }
  }
  do_raise_exception_err_mips64
            ((CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143),exception,error_code,retaddr);
}

Assistant:

void mips_cpu_do_unaligned_access(CPUState *cs, vaddr addr,
                                  MMUAccessType access_type,
                                  int mmu_idx, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    int error_code = 0;
    int excp;

    if (!(env->hflags & MIPS_HFLAG_DM)) {
        env->CP0_BadVAddr = addr;
    }

    if (access_type == MMU_DATA_STORE) {
        excp = EXCP_AdES;
    } else {
        excp = EXCP_AdEL;
        if (access_type == MMU_INST_FETCH) {
            error_code |= EXCP_INST_NOTAVAIL;
        }
    }

    do_raise_exception_err(env, excp, error_code, retaddr);
}